

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::CmpHelperNeCollections<int*,int*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,char *expr1b,char *expr1e,
          char *expr2b,char *expr2e,int *b1,int *e1,int *b2,int *e2)

{
  AssertionResult *pAVar1;
  AssertionResult ar;
  char *local_88;
  char *local_80;
  char *local_78;
  iuutil *local_70;
  pointer local_68;
  AssertionResult local_60;
  AssertionResult local_38;
  
  local_88 = expr2b;
  local_80 = expr1e;
  local_78 = expr1b;
  local_70 = this;
  CmpHelperNeIterator<int*,int*>(&local_38,(iuutil *)expr2e,b1,e1,b2,(int *)expr2e);
  if (local_38.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_60.m_message._M_dataplus._M_p = (pointer)&local_60.m_message.field_2;
    local_60.m_message._M_string_length = 0;
    local_60.m_message.field_2._M_local_buf[0] = '\0';
    local_60.m_result = false;
    pAVar1 = iutest::AssertionResult::operator<<(&local_60,(char (*) [20])"error: Expected: { ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char **)&local_70);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [3])0x314f47);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_78);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [9])" } != { ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_80);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [3])0x314f47);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_88);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [13])" }\n  Actual:");
    local_68 = local_38.m_message._M_dataplus._M_p;
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_68);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeCollections(const char* expr1b, const char* expr1e
    , const char* expr2b, const char* expr2e
    , T1 b1, T1 e1, T2 b2, T2 e2)
{
    if( ::iutest::AssertionResult ar = CmpHelperNeIterator(b1, e1, b2, e2) )
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: { " << expr1b << ", " << expr1e << " } != { "
            << expr2b << ", " << expr2e << " }\n  Actual:" << GetAssertionResultMessage(ar);
    }
}